

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printMemExtend(MCInst *MI,uint OpNum,SStream *O,char SrcRegKind,uint Width)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  MCOperand *pMVar4;
  int64_t iVar5;
  char in_CL;
  SStream *in_RDX;
  undefined8 uVar6;
  uint in_ESI;
  MCInst *in_RDI;
  _Bool IsLSL;
  uint DoShift;
  uint SignExtend;
  char *in_stack_ffffffffffffffb8;
  SStream *in_stack_ffffffffffffffc0;
  
  pMVar4 = MCInst_getOperand(in_RDI,in_ESI);
  iVar5 = MCOperand_getImm(pMVar4);
  iVar2 = (int)iVar5;
  pMVar4 = MCInst_getOperand(in_RDI,in_ESI + 1);
  iVar5 = MCOperand_getImm(pMVar4);
  if (iVar2 == 0 && in_CL == 'x') {
    SStream_concat0(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar1 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x21;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
  }
  else {
    uVar6 = 0x75;
    if (iVar2 != 0) {
      uVar6 = 0x73;
    }
    SStream_concat(in_RDX,"%cxt%c",uVar6,(ulong)(uint)(int)in_CL);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      if (iVar2 == 0) {
        if (in_CL == 'b') {
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x29;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
        else if (in_CL == 'h') {
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x29;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
        else if (in_CL == 'w') {
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x29;
          puVar1[0] = '\x03';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
      }
      else {
        switch(in_CL) {
        case 'b':
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x29;
          puVar1[0] = '\x05';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          break;
        default:
          break;
        case 'h':
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x29;
          puVar1[0] = '\x06';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          break;
        case 'w':
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x29;
          puVar1[0] = '\a';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          break;
        case 'x':
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x29;
          puVar1[0] = '\b';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
        }
      }
    }
  }
  if (((int)iVar5 != 0) || (iVar2 == 0 && in_CL == 'x')) {
    uVar3 = Log2_32(0);
    SStream_concat(in_RDX," #%u",(ulong)uVar3);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar1 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x21;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar3 = Log2_32(0);
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x25) = uVar3;
    }
  }
  return;
}

Assistant:

static void printMemExtend(MCInst *MI, unsigned OpNum, SStream *O, char SrcRegKind, unsigned Width)
{
	unsigned SignExtend = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	unsigned DoShift = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 1));

	// sxtw, sxtx, uxtw or lsl (== uxtx)
	bool IsLSL = !SignExtend && SrcRegKind == 'x';
	if (IsLSL) {
		SStream_concat0(O, "lsl");
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.type = ARM64_SFT_LSL;
		}
	} else {
		SStream_concat(O, "%cxt%c", (SignExtend ? 's' : 'u'), SrcRegKind);
		if (MI->csh->detail) {
			if (!SignExtend) {
				switch(SrcRegKind) {
					default: break;
					case 'b':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTB;
							 break;
					case 'h':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTH;
							 break;
					case 'w':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTW;
							 break;
				}
			} else {
					switch(SrcRegKind) {
						default: break;
						case 'b':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTB;
							break;
						case 'h':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTH;
							break;
						case 'w':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTW;
							break;
						case 'x':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTX;
							break;
					}
			}
		}
	}

	if (DoShift || IsLSL) {
		SStream_concat(O, " #%u", Log2_32(Width / 8));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.value = Log2_32(Width / 8);
		}
	}
}